

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall
Catch::RunContext::testGroupEnded
          (RunContext *this,string *testSpec,Totals *totals,size_t groupIndex,size_t groupsCount)

{
  IStreamingReporter *pIVar1;
  pointer pcVar2;
  ulong uVar3;
  int iVar4;
  undefined1 *local_d8;
  long local_d0;
  undefined1 local_c8 [16];
  size_t local_b8;
  size_t sStack_b0;
  undefined **local_a8;
  undefined1 *local_a0 [2];
  undefined1 local_90 [16];
  size_t local_80;
  size_t sStack_78;
  int local_70;
  undefined4 uStack_6c;
  undefined4 uStack_68;
  undefined4 uStack_64;
  undefined4 local_60;
  undefined4 uStack_5c;
  undefined4 uStack_58;
  undefined4 uStack_54;
  undefined4 local_50;
  undefined4 uStack_4c;
  undefined4 uStack_48;
  undefined4 uStack_44;
  size_t local_40;
  undefined1 local_38;
  
  pIVar1 = (this->m_reporter)._M_t.
           super___uniq_ptr_impl<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>
           ._M_t.
           super__Tuple_impl<0UL,_Catch::IStreamingReporter_*,_std::default_delete<Catch::IStreamingReporter>_>
           .super__Head_base<0UL,_Catch::IStreamingReporter_*,_false>._M_head_impl;
  local_d8 = local_c8;
  pcVar2 = (testSpec->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_d8,pcVar2,pcVar2 + testSpec->_M_string_length);
  uVar3 = (this->m_totals).assertions.failed;
  local_b8 = groupIndex;
  sStack_b0 = groupsCount;
  iVar4 = (*(((this->m_config).super___shared_ptr<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr)->super_NonCopyable)._vptr_NonCopyable[9])();
  local_a8 = &PTR__TestGroupStats_0024aed0;
  local_a0[0] = local_90;
  std::__cxx11::string::_M_construct<char*>((string *)local_a0,local_d8,local_d8 + local_d0);
  local_38 = (ulong)(long)iVar4 <= uVar3;
  local_80 = local_b8;
  sStack_78 = sStack_b0;
  local_70 = totals->error;
  uStack_6c = *(undefined4 *)&totals->field_0x4;
  uStack_68 = (undefined4)(totals->assertions).passed;
  uStack_64 = *(undefined4 *)((long)&(totals->assertions).passed + 4);
  local_60 = (undefined4)(totals->assertions).failed;
  uStack_5c = *(undefined4 *)((long)&(totals->assertions).failed + 4);
  uStack_58 = (undefined4)(totals->assertions).failedButOk;
  uStack_54 = *(undefined4 *)((long)&(totals->assertions).failedButOk + 4);
  local_50 = (undefined4)(totals->testCases).passed;
  uStack_4c = *(undefined4 *)((long)&(totals->testCases).passed + 4);
  uStack_48 = (undefined4)(totals->testCases).failed;
  uStack_44 = *(undefined4 *)((long)&(totals->testCases).failed + 4);
  local_40 = (totals->testCases).failedButOk;
  (*pIVar1->_vptr_IStreamingReporter[0xd])(pIVar1);
  local_a8 = &PTR__TestGroupStats_0024aed0;
  if (local_a0[0] != local_90) {
    operator_delete(local_a0[0]);
  }
  if (local_d8 != local_c8) {
    operator_delete(local_d8);
  }
  return;
}

Assistant:

void RunContext::testGroupEnded(std::string const& testSpec, Totals const& totals, std::size_t groupIndex, std::size_t groupsCount) {
        m_reporter->testGroupEnded(TestGroupStats(GroupInfo(testSpec, groupIndex, groupsCount), totals, aborting()));
    }